

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# workspace_pool.cc
# Opt level: O2

void * __thiscall
tvm::runtime::WorkspacePool::Pool::Alloc(Pool *this,TVMContext ctx,DeviceAPI *device,size_t nbytes)

{
  int iVar1;
  long lVar2;
  undefined4 extraout_var;
  ulong uVar3;
  Entry *pEVar4;
  const_iterator __position;
  ulong uVar5;
  Entry e;
  
  uVar3 = nbytes + 0xfff & 0xfffffffffffff000;
  uVar5 = 0x1000;
  if (uVar3 != 0) {
    uVar5 = uVar3;
  }
  __position._M_current =
       (this->free_list_).
       super__Vector_base<tvm::runtime::WorkspacePool::Pool::Entry,_std::allocator<tvm::runtime::WorkspacePool::Pool::Entry>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  lVar2 = (long)__position._M_current -
          (long)(this->free_list_).
                super__Vector_base<tvm::runtime::WorkspacePool::Pool::Entry,_std::allocator<tvm::runtime::WorkspacePool::Pool::Entry>_>
                ._M_impl.super__Vector_impl_data._M_start >> 4;
  if (lVar2 != 1) {
    if (lVar2 == 2) {
      e.data = __position._M_current[-1].data;
      e.size = __position._M_current[-1].size;
      (this->free_list_).
      super__Vector_base<tvm::runtime::WorkspacePool::Pool::Entry,_std::allocator<tvm::runtime::WorkspacePool::Pool::Entry>_>
      ._M_impl.super__Vector_impl_data._M_finish = __position._M_current + -1;
      if (uVar5 <= e.size) goto LAB_001092c6;
    }
    else {
      if (uVar5 <= __position._M_current[-1].size) {
        do {
          pEVar4 = __position._M_current;
          __position._M_current = pEVar4 + -1;
        } while (uVar5 <= pEVar4[-2].size);
        e.data = (__position._M_current)->data;
        e.size = pEVar4[-1].size;
        std::
        vector<tvm::runtime::WorkspacePool::Pool::Entry,_std::allocator<tvm::runtime::WorkspacePool::Pool::Entry>_>
        ::erase(&this->free_list_,__position);
        goto LAB_001092c6;
      }
      e.data = __position._M_current[-1].data;
      e.size = __position._M_current[-1].size;
      (this->free_list_).
      super__Vector_base<tvm::runtime::WorkspacePool::Pool::Entry,_std::allocator<tvm::runtime::WorkspacePool::Pool::Entry>_>
      ._M_impl.super__Vector_impl_data._M_finish = __position._M_current + -1;
    }
    (*device->_vptr_DeviceAPI[5])(device,ctx,e.data);
  }
  iVar1 = (*device->_vptr_DeviceAPI[4])(device,ctx,uVar5,0x40,0x10801);
  e.data = (void *)CONCAT44(extraout_var,iVar1);
  e.size = uVar5;
LAB_001092c6:
  std::
  vector<tvm::runtime::WorkspacePool::Pool::Entry,_std::allocator<tvm::runtime::WorkspacePool::Pool::Entry>_>
  ::push_back(&this->allocated_,&e);
  return e.data;
}

Assistant:

void *Alloc(TVMContext ctx, DeviceAPI *device, size_t nbytes) {
    // Allocate align to page.
    nbytes = (nbytes + (kWorkspacePageSize - 1)) / kWorkspacePageSize * kWorkspacePageSize;
    if (nbytes == 0)
      nbytes = kWorkspacePageSize;
    Entry e;
    TVMType type;
    type.code = kDLUInt;
    type.bits = 8;
    type.lanes = 1;
    if (free_list_.size() == 2) {
      e = free_list_.back();
      free_list_.pop_back();
      if (e.size < nbytes) {
        // resize the page
        device->FreeDataSpace(ctx, e.data);
        e.data = device->AllocDataSpace(ctx, nbytes, kTempAllocaAlignment, type);
        e.size = nbytes;
      }
    } else if (free_list_.size() == 1) {
      e.data = device->AllocDataSpace(ctx, nbytes, kTempAllocaAlignment, type);
      e.size = nbytes;
    } else {
      if (free_list_.back().size >= nbytes) {
        // find smallest fit
        auto it = free_list_.end() - 2;
        for (; it->size >= nbytes; --it) {
        }
        e = *(it + 1);
        free_list_.erase(it + 1);
      } else {
        // resize the page
        e = free_list_.back();
        free_list_.pop_back();
        device->FreeDataSpace(ctx, e.data);
        e.data = device->AllocDataSpace(ctx, nbytes, kTempAllocaAlignment, type);
        e.size = nbytes;
      }
    }
    allocated_.push_back(e);
    return e.data;
  }